

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int lws_system_blob_get(lws_system_blob_t *b,uint8_t *buf,size_t *len,size_t ofs)

{
  int iVar1;
  int n;
  size_t ofs_local;
  size_t *len_local;
  uint8_t *buf_local;
  lws_system_blob_t *b_local;
  
  if (b->is_direct == '\0') {
    iVar1 = lws_buflist_linear_copy((lws_buflist **)b,ofs,buf,*len);
    if (iVar1 < 0) {
      b_local._4_4_ = -2;
    }
    else {
      *len = (long)iVar1;
      b_local._4_4_ = 0;
    }
  }
  else {
    if ((b->u).bl == (lws_buflist *)0x0) {
      __assert_fail("b->u.direct.ptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/system/system.c"
                    ,0x53,
                    "int lws_system_blob_get(lws_system_blob_t *, uint8_t *, size_t *, size_t)");
    }
    if (ofs < (b->u).direct.len) {
      if ((b->u).direct.len - ofs < *len) {
        *len = (b->u).direct.len - ofs;
      }
      memcpy(buf,(void *)((long)&((b->u).bl)->next + ofs),*len);
      b_local._4_4_ = 0;
    }
    else {
      *len = 0;
      b_local._4_4_ = 1;
    }
  }
  return b_local._4_4_;
}

Assistant:

int
lws_system_blob_get(lws_system_blob_t *b, uint8_t *buf, size_t *len, size_t ofs)
{
	int n;

	if (b->is_direct) {

		assert(b->u.direct.ptr);

		if (ofs >= b->u.direct.len) {
			*len = 0;
			return 1;
		}

		if (*len > b->u.direct.len - ofs)
			*len = b->u.direct.len - ofs;

		memcpy(buf, b->u.direct.ptr + ofs, *len);

		return 0;
	}

	n = lws_buflist_linear_copy(&b->u.bl, ofs, buf, *len);
	if (n < 0)
		return -2;

	*len = n;

	return 0;
}